

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  int iVar1;
  long lVar2;
  value_type_conflict4 *pvVar3;
  char *pcVar4;
  int *piVar5;
  string local_1e8 [36];
  int local_1c4;
  iterator iStack_1c0;
  int err;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pointer_based_iterator<char> local_1a8;
  pointer_based_iterator<char> out;
  small_vector<char,_256UL> buffer;
  allocator local_61;
  string local_60 [32];
  path local_40 [8];
  string path;
  string *directory_local;
  file_handle *this_local;
  
  close(this,(int)__file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"pst-XXXXXX",&local_61);
  pstore::path::join(local_40,(string *)__file,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  lVar2 = std::__cxx11::string::length();
  small_vector<char,_256UL>::small_vector((small_vector<char,_256UL> *)&out,lVar2 + 1);
  local_1b0._M_current =
       (char *)std::begin<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40);
  local_1b8._M_current =
       (char *)std::end<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40);
  iStack_1c0 = std::begin<pstore::small_vector<char,256ul>>((small_vector<char,_256UL> *)&out);
  local_1a8 = std::
              copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,pstore::pointer_based_iterator<char>>
                        (local_1b0,local_1b8,iStack_1c0.pos_);
  pvVar3 = pointer_based_iterator<char>::operator*(&local_1a8);
  *pvVar3 = '\0';
  pcVar4 = small_vector<char,_256UL>::data((small_vector<char,_256UL> *)&out);
  iVar1 = mkstemp(pcVar4);
  this->file_ = iVar1;
  piVar5 = __errno_location();
  local_1c4 = *piVar5;
  pcVar4 = small_vector<char,_256UL>::data((small_vector<char,_256UL> *)&out);
  std::__cxx11::string::operator=((string *)&this->path_,pcVar4);
  iVar1 = local_1c4;
  this->is_writable_ = true;
  if (this->file_ == -1) {
    std::__cxx11::string::string(local_1e8,(string *)__file);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar1,"Unable to create unique file in directory",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
  }
  small_vector<char,_256UL>::~small_vector((small_vector<char,_256UL> *)&out);
  iVar1 = std::__cxx11::string::~string((string *)local_40);
  return iVar1;
}

Assistant:

void file_handle::open (unique const, std::string const & directory) {
            this->close ();

            std::string const path = path::join (directory, "pst-XXXXXX");

            // mkstemp() modifies its input parameter so that on return it contains
            // the actual name of the temporary file that was created.
            small_vector<char> buffer (path.length () + 1);
            auto out = std::copy (std::begin (path), std::end (path), std::begin (buffer));
            *out = '\0';

            file_ = ::mkstemp (buffer.data ());
            int const err = errno;
            path_ = buffer.data ();
            is_writable_ = true;
            if (file_ == -1) {
                raise_file_error (err, "Unable to create unique file in directory", directory);
            }
        }